

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QSqlField *f)

{
  QArrayData *pQVar1;
  long lVar2;
  char cVar3;
  long in_RDX;
  char *pcVar4;
  undefined8 *puVar5;
  storage_type *psVar6;
  char16_t *pcVar7;
  QTextStream *pQVar8;
  char *pcVar9;
  PrivateShared *this;
  QArrayData *pQVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QDebugStateSaver saver;
  QDebug local_70;
  undefined8 local_68;
  QDebug local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)f);
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  pQVar8[0x30] = (QTextStream)0x0;
  QVar11.m_data = (storage_type *)0xa;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  pQVar1 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 8);
  puVar5 = *(undefined8 **)(*(long *)(in_RDX + 0x20) + 0x10);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)f,(ulong)puVar5);
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  QVar12.m_data = (storage_type *)0x2;
  QVar12.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar12);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  lVar2 = *(long *)(*(long *)(in_RDX + 0x20) + 0x58);
  if (lVar2 == 0) {
    this = (f->val).d.data.shared;
LAB_0012113a:
    psVar6 = (storage_type *)0x0;
  }
  else {
    lVar2 = *(long *)(lVar2 + 0x18);
    this = (f->val).d.data.shared;
    if (lVar2 == 0) goto LAB_0012113a;
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar4 = psVar6 + lVar2 + 1;
      psVar6 = psVar6 + 1;
    } while (*pcVar4 != '\0');
  }
  QVar13.m_data = psVar6;
  QVar13.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar13);
  QTextStream::operator<<((QTextStream *)this,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  QVar14.m_data = (storage_type *)0xd;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar14);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  pQVar1 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 0x20);
  lVar2 = *(long *)(*(long *)(in_RDX + 0x20) + 0x30);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 == 0) {
    pcVar7 = L"(not specified)";
  }
  else {
    pQVar10 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 0x20);
    pcVar7 = *(char16_t **)(*(long *)(in_RDX + 0x20) + 0x28);
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      goto LAB_0012124b;
    }
  }
  pQVar10 = (QArrayData *)0x0;
LAB_0012124b:
  if (pcVar7 == (char16_t *)0x0) {
    pcVar7 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)f,(ulong)pcVar7);
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (-1 < *(int *)(*(long *)(in_RDX + 0x20) + 100)) {
    QVar15.m_data = (storage_type *)0xa;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
    QTextStream::operator<<(pQVar8,*(int *)(*(long *)(in_RDX + 0x20) + 100));
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
  }
  if (-1 < *(int *)(*(long *)(in_RDX + 0x20) + 0x68)) {
    QVar16.m_data = (storage_type *)0xd;
    QVar16.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<(pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
    QTextStream::operator<<(pQVar8,*(int *)(*(long *)(in_RDX + 0x20) + 0x68));
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
  }
  if (*(int *)(*(long *)(in_RDX + 0x20) + 0x60) != -1) {
    QVar17.m_data = (storage_type *)0xc;
    QVar17.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<(pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
    pcVar4 = "no";
    if (*(int *)(*(long *)(in_RDX + 0x20) + 0x60) == 1) {
      pcVar4 = "yes";
    }
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar9 = psVar6 + (long)(pcVar4 + 1);
      psVar6 = psVar6 + 1;
    } while (*pcVar9 != '\0');
    QVar18.m_data = psVar6;
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<(pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)(f->val).d.data.shared;
    }
  }
  QVar19.m_data = (storage_type *)0xd;
  QVar19.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar19);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  pcVar4 = "yes";
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 2) == 0) {
    pcVar4 = "no";
  }
  psVar6 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar9 = psVar6 + (long)(pcVar4 + 1);
    psVar6 = psVar6 + 1;
  } while (*pcVar9 != '\0');
  QVar20.m_data = psVar6;
  QVar20.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar20);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
  }
  QVariant::QVariant((QVariant *)&local_58,(QVariant *)(*(long *)(in_RDX + 0x20) + 0x38));
  cVar3 = QVariant::isNull();
  QVariant::~QVariant((QVariant *)&local_58);
  if (cVar3 == '\0') {
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    QVar21.m_data = (storage_type *)0x11;
    QVar21.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<(pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar8[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar8,' ');
    }
    QVariant::QVariant((QVariant *)&local_58,(QVariant *)(*(long *)(in_RDX + 0x20) + 0x38));
    local_60.stream = (Stream *)(f->val).d.data.shared;
    *(int *)((PrivateShared *)local_60.stream + 0x28) =
         *(int *)((PrivateShared *)local_60.stream + 0x28) + 1;
    QVariant::qdebugHelper((Stream *)&local_70);
    QDebug::~QDebug(&local_60);
    QTextStream::operator<<((QTextStream *)local_70.stream,'\"');
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QDebug::~QDebug(&local_70);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  QVar22.m_data = (storage_type *)0xd;
  QVar22.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar22);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  pcVar9 = "true";
  pcVar4 = "true";
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 4) == 0) {
    pcVar4 = "false";
  }
  QTextStream::operator<<(pQVar8,pcVar4);
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  QVar23.m_data = (storage_type *)0xc;
  QVar23.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar23);
  QTextStream::operator<<(pQVar8,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 1) == 0) {
    pcVar9 = "false";
  }
  QTextStream::operator<<(pQVar8,pcVar9);
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  QTextStream::operator<<(pQVar8,')');
  pQVar8 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)(f->val).d.data.shared;
  }
  (f->val).d.data.shared = (PrivateShared *)0x0;
  *(QTextStream **)dbg.stream = pQVar8;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlField &f)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlField(" << f.name() << ", " << f.metaType().name();
    dbg << ", tableName: " << (f.tableName().isEmpty() ? QStringLiteral("(not specified)") : f.tableName());
    if (f.length() >= 0)
        dbg << ", length: " << f.length();
    if (f.precision() >= 0)
        dbg << ", precision: " << f.precision();
    if (f.requiredStatus() != QSqlField::Unknown)
        dbg << ", required: "
            << (f.requiredStatus() == QSqlField::Required ? "yes" : "no");
    dbg  << ", generated: " << (f.isGenerated() ? "yes" : "no");
    if (!f.defaultValue().isNull())
        dbg << ", defaultValue: \"" << f.defaultValue() << '\"';
    dbg << ", autoValue: " << f.isAutoValue()
        << ", readOnly: " << f.isReadOnly() << ')';
    return dbg;
}